

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::
prettify<duckdb_fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  counting_iterator cVar9;
  int i;
  int iVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  _Distance __n;
  size_t sVar17;
  
  uVar13 = this->num_digits_;
  uVar15 = this->exp_;
  lVar16 = (long)(int)uVar13;
  uVar6 = uVar15 + uVar13;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    lVar14 = (this->specs_).precision - lVar16;
    bVar12 = (byte)(uVar1 >> 0x1d) & 0 < (int)lVar14;
    lVar16 = lVar16 + -1;
    if ((int)uVar13 < 2) {
      lVar16 = 0;
    }
    lVar16 = it.count_ + lVar16 + (ulong)(1 < (int)uVar13 | bVar12);
    if (bVar12 == 0) {
      lVar14 = 0;
    }
    uVar6 = uVar6 - 1;
    lVar8 = lVar14 + lVar16 + 3;
    uVar13 = -uVar6;
    if (0 < (int)uVar6) {
      uVar13 = uVar6;
    }
    lVar16 = lVar14 + 4 + lVar16;
    if (uVar13 < 1000) {
      lVar16 = lVar8;
    }
    lVar16 = lVar16 + 1;
    if (uVar13 < 100) {
      lVar16 = lVar8;
    }
    return (counting_iterator)(lVar16 + 2);
  }
  if (-1 < (int)uVar15) {
    if ((int)uVar6 < 4 || (uVar1 & 0xff0000) == 0) {
      cVar9.count_ = lVar16 + it.count_;
      if ((int)uVar13 < 1) {
        cVar9.count_ = it.count_;
      }
      it.count_ = cVar9.count_ + uVar15;
    }
    else {
      uVar15 = 3;
      if (uVar6 % 3 != 0) {
        uVar15 = uVar6 % 3;
      }
      iVar10 = 0;
      do {
        sVar17 = (0 < iVar10) + it.count_;
        uVar11 = uVar13 - iVar10;
        if (uVar11 == 0 || (int)uVar13 < iVar10) {
          it.count_ = sVar17 + uVar15;
        }
        else {
          uVar4 = uVar11;
          if ((int)uVar15 < (int)uVar11) {
            uVar4 = uVar15;
          }
          it.count_ = sVar17 + (long)(int)uVar4;
          if ((int)uVar11 < 1) {
            it.count_ = sVar17;
          }
          if ((int)uVar11 < (int)uVar15) {
            uVar11 = uVar15 - uVar4;
            if ((int)(uVar15 - uVar4) < 1) {
              uVar11 = 0;
            }
            it.count_ = it.count_ + uVar11;
          }
        }
        iVar10 = iVar10 + uVar15;
        uVar15 = 3;
      } while (iVar10 < (int)uVar6);
    }
    if ((uVar1 >> 0x1d & 1) == 0) {
      return (counting_iterator)it.count_;
    }
    iVar10 = (this->specs_).precision;
    iVar7 = iVar10 - uVar6;
    if (iVar7 != 0 && (int)uVar6 <= iVar10) {
      return (counting_iterator)(it.count_ + (iVar7 - 1) + 2);
    }
    return (counting_iterator)((it.count_ - ((uVar1 & 0xff) == 2)) + 2);
  }
  if (0 < (int)uVar6) {
    if (uVar6 < 4 || (uVar1 & 0xff0000) == 0) {
      it.count_ = it.count_ + uVar6;
    }
    else {
      uVar15 = uVar6 % 3;
      if (uVar6 % 3 == 0) {
        uVar15 = 3;
      }
      iVar10 = 0;
      do {
        it.count_ = (0 < iVar10) + it.count_ + (ulong)uVar15;
        iVar10 = iVar10 + uVar15;
        uVar15 = 3;
      } while (iVar10 < (int)uVar6);
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      lVar16 = (it.count_ - uVar6) + lVar16;
      sVar17 = lVar16 + 1;
      iVar10 = (this->specs_).precision;
      iVar7 = iVar10 - uVar13;
      if (iVar7 == 0 || iVar10 < (int)uVar13) {
        return (counting_iterator)sVar17;
      }
      if (iVar7 < 1) {
        return (counting_iterator)sVar17;
      }
      return (counting_iterator)(lVar16 + 2 + (ulong)(iVar7 - 1));
    }
    uVar15 = uVar13 - 1;
    if ((int)uVar6 < (int)(uVar13 - 1)) {
      uVar15 = uVar6;
    }
    do {
      if (this->digits_[lVar16 + -1] != '0') {
        uVar15 = (uint)lVar16;
        break;
      }
      lVar16 = lVar16 + -1;
    } while ((long)(ulong)uVar6 < lVar16);
    sVar17 = it.count_ + (uVar15 != uVar6);
    if ((int)uVar6 < (int)uVar15) {
      return (counting_iterator)((sVar17 - uVar6) + (long)(int)uVar15);
    }
    return (counting_iterator)sVar17;
  }
  iVar7 = -uVar6;
  iVar10 = iVar7;
  if (uVar13 == 0) {
    iVar2 = (this->specs_).precision;
    if (SBORROW4(iVar2,iVar7) != (int)(iVar2 + uVar6) < 0) {
      iVar10 = iVar2;
    }
    if (iVar2 < 0) {
      iVar10 = iVar7;
    }
  }
  else {
    if ((int)uVar13 < 1 || (uVar1 >> 0x1d & 1) != 0) goto LAB_011a8781;
    do {
      if (this->digits_[(ulong)uVar13 - 1] != '0') goto LAB_011a8781;
      bVar3 = 1 < (int)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar3);
  }
  iVar7 = iVar10;
  uVar13 = 0;
  if (iVar7 == 0) {
    return (counting_iterator)(it.count_ + 1);
  }
LAB_011a8781:
  lVar16 = it.count_ + 3 + (ulong)(iVar7 - 1);
  if (iVar7 < 1) {
    lVar16 = it.count_ + 2;
  }
  uVar5 = 0;
  if (0 < (int)uVar13) {
    uVar5 = (ulong)uVar13;
  }
  return (counting_iterator)(uVar5 + lVar16);
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }